

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

uint32_t helper_sve_predtest_aarch64(void *vd,void *vg,uint32_t words)

{
  undefined8 local_38;
  uintptr_t i;
  uint64_t *g;
  uint64_t *d;
  uint32_t flags;
  uint32_t words_local;
  void *vg_local;
  void *vd_local;
  
  d._0_4_ = 1;
  local_38 = 0;
  do {
    d._0_4_ = iter_predtest_fwd(*(uint64_t *)((long)vd + local_38 * 8),
                                *(uint64_t *)((long)vg + local_38 * 8),(uint32_t)d);
    local_38 = local_38 + 1;
  } while (local_38 < words);
  return (uint32_t)d;
}

Assistant:

uint32_t HELPER(sve_predtest)(void *vd, void *vg, uint32_t words)
{
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg;
    uintptr_t i = 0;

    do {
        flags = iter_predtest_fwd(d[i], g[i], flags);
    } while (++i < words);

    return flags;
}